

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

CustomLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_custom(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  CustomLayerParams *pCVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_custom(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_custom(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pCVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::CustomLayerParams>(arena);
    (this->layer_).custom_ = pCVar2;
  }
  return (CustomLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::CustomLayerParams* NeuralNetworkLayer::_internal_mutable_custom() {
  if (!_internal_has_custom()) {
    clear_layer();
    set_has_custom();
    layer_.custom_ = CreateMaybeMessage< ::CoreML::Specification::CustomLayerParams >(GetArenaForAllocation());
  }
  return layer_.custom_;
}